

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O3

size_t ZSTD_decompressSequences
                 (ZSTD_DCtx *dctx,void *dst,size_t maxDstSize,void *seqStart,size_t seqSize,
                 int nbSeq,ZSTD_longOffset_e isLongOffset)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  BYTE BVar4;
  size_t sVar5;
  seq_t sequence;
  uint uVar6;
  int iVar7;
  BYTE *op_2;
  long lVar8;
  ulong uVar9;
  BYTE *pBVar10;
  ulong uVar11;
  BYTE *pBVar12;
  uint uVar13;
  BYTE *pBVar14;
  BYTE *pBVar15;
  BYTE *oend;
  BYTE *pBVar16;
  ulong uVar17;
  BYTE *pBVar18;
  ulong uVar19;
  BYTE *pBVar20;
  BYTE *ip_1;
  void *pvVar21;
  size_t __n;
  bool bVar22;
  BYTE *litPtr;
  seqState_t seqState;
  BYTE *local_130;
  BYTE *local_128;
  BIT_DStream_t local_120;
  ZSTD_fseState local_f8;
  ZSTD_fseState local_e8;
  ZSTD_fseState local_d8;
  ulong local_c8 [6];
  BYTE *local_98;
  BYTE *local_90;
  BYTE *local_88;
  BYTE *local_80;
  void *local_78;
  BYTE *local_70;
  ulong *local_68;
  ulong local_60;
  ZSTD_seqSymbol *local_58;
  ulong local_50;
  size_t sStack_48;
  ulong local_40;
  BYTE *pBStack_38;
  
  local_130 = dctx->litPtr;
  sVar5 = dctx->litSize;
  pBVar12 = local_130 + sVar5;
  pBVar15 = (BYTE *)(maxDstSize + (long)dst);
  pvVar21 = dst;
  if (nbSeq == 0) {
LAB_0045b3ab:
    uVar11 = (long)pBVar12 - (long)local_130;
    pBVar20 = (BYTE *)0xffffffffffffffba;
    if (uVar11 <= (ulong)((long)pBVar15 - (long)dst)) {
      memcpy(dst,local_130,uVar11);
      pBVar20 = (BYTE *)((long)dst + (uVar11 - (long)pvVar21));
    }
  }
  else {
    pBVar12 = (BYTE *)dctx->prefixStart;
    local_88 = (BYTE *)dctx->virtualStart;
    local_90 = (BYTE *)dctx->dictEnd;
    dctx->fseEntropy = 1;
    lVar8 = -0xc;
    do {
      *(ulong *)((long)local_c8 + lVar8 * 2 + 0x18) =
           (ulong)*(uint *)((long)dctx->workspace + lVar8);
      lVar8 = lVar8 + 4;
    } while (lVar8 != 0);
    pBVar20 = (BYTE *)0xffffffffffffffec;
    if (seqSize != 0) {
      local_120.limitPtr = (char *)((long)seqStart + 8);
      if (seqSize < 8) {
        local_120.bitContainer = (size_t)*seqStart;
        switch(seqSize) {
        case 7:
          local_120.bitContainer =
               local_120.bitContainer | (ulong)*(byte *)((long)seqStart + 6) << 0x30;
        case 6:
          local_120.bitContainer =
               local_120.bitContainer + ((ulong)*(byte *)((long)seqStart + 5) << 0x28);
        case 5:
          local_120.bitContainer =
               local_120.bitContainer + ((ulong)*(byte *)((long)seqStart + 4) << 0x20);
        case 4:
          local_120.bitContainer =
               local_120.bitContainer + (ulong)*(byte *)((long)seqStart + 3) * 0x1000000;
        case 3:
          local_120.bitContainer =
               local_120.bitContainer + (ulong)*(byte *)((long)seqStart + 2) * 0x10000;
        case 2:
          local_120.bitContainer =
               (ulong)*(byte *)((long)seqStart + 1) * 0x100 + local_120.bitContainer;
        }
        bVar1 = *(byte *)((long)seqStart + (seqSize - 1));
        if (bVar1 == 0) {
          return 0xffffffffffffffec;
        }
        uVar13 = 0x1f;
        if (bVar1 != 0) {
          for (; bVar1 >> uVar13 == 0; uVar13 = uVar13 - 1) {
          }
        }
        local_120.bitsConsumed = (uVar13 ^ 0x1f) + (int)seqSize * -8 + 0x29;
        local_120.ptr = (char *)seqStart;
      }
      else {
        local_120.ptr = (char *)((long)seqStart + (seqSize - 8));
        local_120.bitContainer = *(size_t *)local_120.ptr;
        if (local_120.bitContainer >> 0x38 == 0) {
          return 0xffffffffffffffec;
        }
        uVar13 = 0x1f;
        bVar1 = (byte)(local_120.bitContainer >> 0x38);
        if (bVar1 != 0) {
          for (; bVar1 >> uVar13 == 0; uVar13 = uVar13 - 1) {
          }
        }
        local_120.bitsConsumed = ~uVar13 + 9;
        if (0xffffffffffffff88 < seqSize) {
          return 0xffffffffffffffec;
        }
      }
      local_128 = (BYTE *)(maxDstSize + (long)dst);
      local_120.start = (char *)seqStart;
      local_80 = local_130 + sVar5;
      ZSTD_initFseState(&local_f8,&local_120,dctx->LLTptr);
      ZSTD_initFseState(&local_e8,&local_120,dctx->OFTptr);
      ZSTD_initFseState(&local_d8,&local_120,dctx->MLTptr);
      local_70 = local_128 + -0xd;
      local_78 = dst;
      local_98 = local_128 + -8;
      do {
        uVar11 = local_c8[1];
        uVar9 = (ulong)local_120.bitsConsumed;
        if (0x40 < uVar9) {
          if (nbSeq != 0) {
            return 0xffffffffffffffec;
          }
LAB_0045b377:
          lVar8 = 0;
          do {
            (dctx->entropy).rep[lVar8] = (U32)local_c8[lVar8];
            lVar8 = lVar8 + 1;
            pBVar12 = local_80;
            pBVar15 = local_128;
            pvVar21 = local_78;
          } while (lVar8 != 3);
          goto LAB_0045b3ab;
        }
        if (local_120.ptr < local_120.limitPtr) {
          if (local_120.ptr != local_120.start) {
            uVar13 = (int)local_120.ptr - (int)local_120.start;
            if (local_120.start <=
                (ulong *)((long)local_120.ptr - (ulong)(local_120.bitsConsumed >> 3))) {
              uVar13 = local_120.bitsConsumed >> 3;
            }
            local_120.bitsConsumed = local_120.bitsConsumed + uVar13 * -8;
            goto LAB_0045ae75;
          }
        }
        else {
          uVar13 = local_120.bitsConsumed >> 3;
          local_120.bitsConsumed = local_120.bitsConsumed & 7;
LAB_0045ae75:
          local_120.ptr = (char *)((long)local_120.ptr - (ulong)uVar13);
          uVar9 = (ulong)local_120.bitsConsumed;
          local_120.bitContainer = *(size_t *)local_120.ptr;
        }
        bVar22 = nbSeq == 0;
        nbSeq = nbSeq + -1;
        if (bVar22) goto LAB_0045b377;
        local_68 = (ulong *)local_120.limitPtr;
        bVar1 = local_f8.table[local_f8.state].nbAdditionalBits;
        bVar2 = local_d8.table[local_d8.state].nbAdditionalBits;
        bVar3 = local_e8.table[local_e8.state].nbAdditionalBits;
        local_60 = (ulong)local_d8.table[local_d8.state].baseValue;
        uVar13 = (uint)bVar3;
        if (bVar3 == 0) {
          uVar17 = 0;
LAB_0045af29:
          lVar8 = ((ulong)local_f8.table[local_f8.state].baseValue == 0) + uVar17;
          if (lVar8 != 0) {
            if (lVar8 == 3) {
              uVar17 = (local_c8[0] - 1) + (ulong)(local_c8[0] == 1);
LAB_0045af75:
              local_c8[2] = local_c8[1];
            }
            else {
              uVar17 = local_c8[lVar8] + (ulong)(local_c8[lVar8] == 0);
              if (lVar8 != 1) goto LAB_0045af75;
            }
            local_c8[1] = local_c8[0];
            goto LAB_0045af95;
          }
        }
        else {
          uVar17 = ((local_120.bitContainer << ((byte)uVar9 & 0x3f)) >> (-bVar3 & 0x3f)) +
                   (ulong)local_e8.table[local_e8.state].baseValue;
          uVar9 = (ulong)((int)uVar9 + uVar13);
          if (uVar13 == 1) goto LAB_0045af29;
          local_c8[1] = local_c8[0];
          local_c8[2] = uVar11;
LAB_0045af95:
          local_c8[1] = local_c8[0];
          local_c8[0] = uVar17;
        }
        uVar11 = local_c8[0];
        if (bVar2 == 0) {
          uVar17 = 0;
        }
        else {
          uVar17 = (local_120.bitContainer << ((byte)uVar9 & 0x3f)) >> (-bVar2 & 0x3f);
          uVar9 = (ulong)((int)uVar9 + (uint)bVar2);
        }
        uVar6 = (uint)uVar9;
        local_58 = local_e8.table;
        if ((0x1e < (uint)bVar2 + (uint)bVar1 + uVar13) && (uVar6 < 0x41)) {
          if (local_120.ptr < local_120.limitPtr) {
            if (local_120.ptr == local_120.start) goto LAB_0045b02f;
            uVar19 = (ulong)(uint)((int)local_120.ptr - (int)local_120.start);
            if (local_120.start <= (ulong *)((long)local_120.ptr - (uVar9 >> 3))) {
              uVar19 = uVar9 >> 3;
            }
            uVar6 = uVar6 + (int)uVar19 * -8;
          }
          else {
            uVar19 = uVar9 >> 3;
            uVar6 = uVar6 & 7;
          }
          local_120.ptr = (char *)((long)local_120.ptr - uVar19);
          local_120.bitContainer = *(size_t *)local_120.ptr;
        }
LAB_0045b02f:
        if (bVar1 == 0) {
          local_50 = 0;
        }
        else {
          local_50 = (local_120.bitContainer << ((byte)uVar6 & 0x3f)) >> (-bVar1 & 0x3f);
          uVar6 = uVar6 + bVar1;
        }
        __n = uVar17 + local_d8.table[local_d8.state].baseValue;
        iVar7 = uVar6 + local_f8.table[local_f8.state].nbBits;
        local_50 = local_50 + local_f8.table[local_f8.state].baseValue;
        local_f8.state =
             (ulong)((uint)(local_120.bitContainer >> (-(char)iVar7 & 0x3fU)) &
                    BIT_mask[local_f8.table[local_f8.state].nbBits]) +
             (ulong)local_f8.table[local_f8.state].nextState;
        iVar7 = iVar7 + (uint)local_d8.table[local_d8.state].nbBits;
        local_d8.state =
             (ulong)((uint)(local_120.bitContainer >> (-(char)iVar7 & 0x3fU)) &
                    BIT_mask[local_d8.table[local_d8.state].nbBits]) +
             (ulong)local_d8.table[local_d8.state].nextState;
        local_120.bitsConsumed = iVar7 + (uint)local_e8.table[local_e8.state].nbBits;
        local_e8.state =
             (ulong)((uint)(local_120.bitContainer >> (-(char)local_120.bitsConsumed & 0x3fU)) &
                    BIT_mask[local_e8.table[local_e8.state].nbBits]) +
             (ulong)local_e8.table[local_e8.state].nextState;
        sStack_48 = __n;
        local_40 = local_c8[0];
        pBVar20 = (BYTE *)(local_50 + __n);
        pBVar15 = (BYTE *)((long)dst + (long)pBVar20);
        if (local_128 < pBVar15) {
          return 0xffffffffffffffba;
        }
        pBVar10 = local_130 + local_50;
        if (local_80 < pBVar10) {
          return 0xffffffffffffffec;
        }
        pBVar16 = (BYTE *)((long)dst + local_50);
        if (local_98 < pBVar16) {
          sequence.matchLength = __n;
          sequence.litLength = local_50;
          sequence.offset = local_c8[0];
          sequence.match = pBStack_38;
          pBVar20 = (BYTE *)ZSTD_execSequenceLast7
                                      ((BYTE *)dst,local_128,sequence,&local_130,local_80,pBVar12,
                                       local_88,local_90);
        }
        else {
          *(undefined8 *)dst = *(undefined8 *)local_130;
          if (8 < local_50) {
            pBVar18 = (BYTE *)((long)dst + 8);
            do {
              local_130 = local_130 + 8;
              *(undefined8 *)pBVar18 = *(undefined8 *)local_130;
              pBVar18 = pBVar18 + 8;
            } while (pBVar18 < pBVar16);
          }
          pBVar18 = pBVar16 + -local_c8[0];
          local_130 = pBVar10;
          if ((ulong)((long)pBVar16 - (long)pBVar12) < local_c8[0]) {
            if ((ulong)((long)pBVar16 - (long)local_88) < local_c8[0]) {
              return 0xffffffffffffffec;
            }
            lVar8 = (long)(pBVar16 + -local_c8[0]) - (long)pBVar12;
            pBVar10 = local_90 + lVar8;
            if (local_90 < pBVar10 + __n) {
              memmove(pBVar16,pBVar10,-lVar8);
              pBVar16 = pBVar16 + -lVar8;
              sStack_48 = __n + lVar8;
              if ((pBVar16 <= local_98) && (pBVar18 = pBVar12, 2 < sStack_48)) goto LAB_0045b24c;
              if (sStack_48 != 0) {
                uVar11 = 0;
                do {
                  pBVar16[uVar11] = pBVar12[uVar11];
                  uVar11 = uVar11 + 1;
                } while ((uVar11 & 0xffffffff) < sStack_48);
              }
            }
            else {
              memmove(pBVar16,pBVar10,__n);
            }
          }
          else {
LAB_0045b24c:
            if (uVar11 < 8) {
              iVar7 = *(int *)(ZSTD_execSequence_dec64table + uVar11 * 4);
              *pBVar16 = *pBVar18;
              pBVar16[1] = pBVar18[1];
              pBVar16[2] = pBVar18[2];
              pBVar16[3] = pBVar18[3];
              pBVar10 = pBVar18 + *(uint *)(ZSTD_execSequence_dec32table + local_40 * 4);
              pBVar18 = pBVar18 + ((ulong)*(uint *)(ZSTD_execSequence_dec32table + local_40 * 4) -
                                  (long)iVar7);
              *(undefined4 *)(pBVar16 + 4) = *(undefined4 *)pBVar10;
            }
            else {
              *(undefined8 *)pBVar16 = *(undefined8 *)pBVar18;
            }
            pBVar10 = pBVar16 + 8;
            pBVar18 = pBVar18 + 8;
            if (local_70 < pBVar15) {
              pBVar16 = pBVar10;
              pBVar14 = pBVar18;
              if (pBVar10 < local_98) {
                do {
                  *(undefined8 *)pBVar16 = *(undefined8 *)pBVar14;
                  pBVar16 = pBVar16 + 8;
                  pBVar14 = pBVar14 + 8;
                } while (pBVar16 < local_98);
                pBVar18 = pBVar18 + ((long)local_98 - (long)pBVar10);
                pBVar10 = local_98;
              }
              for (; pBVar10 < pBVar15; pBVar10 = pBVar10 + 1) {
                BVar4 = *pBVar18;
                pBVar18 = pBVar18 + 1;
                *pBVar10 = BVar4;
              }
            }
            else {
              do {
                *(undefined8 *)pBVar10 = *(undefined8 *)pBVar18;
                pBVar10 = pBVar10 + 8;
                pBVar18 = pBVar18 + 8;
              } while (pBVar10 < pBVar16 + sStack_48);
            }
          }
        }
        dst = (void *)((long)dst + (long)pBVar20);
      } while (pBVar20 < (BYTE *)0xffffffffffffff89);
    }
  }
  return (size_t)pBVar20;
}

Assistant:

static size_t
ZSTD_decompressSequences(ZSTD_DCtx* dctx, void* dst, size_t maxDstSize,
                   const void* seqStart, size_t seqSize, int nbSeq,
                   const ZSTD_longOffset_e isLongOffset)
{
    DEBUGLOG(5, "ZSTD_decompressSequences");
#if DYNAMIC_BMI2
    if (dctx->bmi2) {
        return ZSTD_decompressSequences_bmi2(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset);
    }
#endif
  return ZSTD_decompressSequences_default(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset);
}